

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayReverseMethod::~ArrayReverseMethod(ArrayReverseMethod *this)

{
  ArrayReverseMethod *this_local;
  
  ~ArrayReverseMethod(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

ArrayReverseMethod() : SystemSubroutine("reverse", SubroutineKind::Function) {}